

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

VarName * __thiscall Parser::parseVarName(Parser *this)

{
  FILE *__stream;
  string *__str;
  char *pcVar1;
  char *pcVar2;
  VarName *this_00;
  TokenType type;
  string local_50;
  undefined1 local_30 [8];
  string temp;
  Parser *this_local;
  
  temp.field_2._8_8_ = this;
  __str = Token::getValue_abi_cxx11_(this->currentToken);
  std::__cxx11::string::string((string *)local_30,__str);
  __stream = _stdout;
  Token::tokenDesc_abi_cxx11_(&local_50,(Token *)0x10,type);
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (&local_50);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30)
  ;
  fprintf(__stream,"\x1b[32m\tParsing [%s] \'%s\'\n\x1b[0m",pcVar1,pcVar2);
  std::__cxx11::string::~string((string *)&local_50);
  loadNextToken(this);
  this_00 = (VarName *)operator_new(0x28);
  VarName::VarName(this_00,(string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  return this_00;
}

Assistant:

VarName *Parser::parseVarName() {
    // Store temp value
    std::string temp = currentToken->getValue();

    // Debug output
    if (_VERBOSITY >= 3) {
        fprintf(stdout, ANSI_COLOR_GREEN "\tParsing [%s] \'%s\'\n" ANSI_COLOR_RESET,
                Token::tokenDesc(TokenType::VarToken).data(), temp.data());
    }

    // Prep next token
    loadNextToken();

    return new VarName(temp);
}